

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void __thiscall
Am_Standard_Opal_Handlers::Configure_Notify
          (Am_Standard_Opal_Handlers *this,Am_Drawonable *draw,int left,int top,int width,int height
          )

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object window;
  
  window.data = (Am_Object_Data *)draw->data_store;
  puVar1 = &((window.data)->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  pAVar6 = Am_Object::Get(&window,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&window,0x67,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  if (iVar2 != left) {
    Am_Object::Set(&window,100,left,0);
  }
  if (iVar3 != top) {
    Am_Object::Set(&window,0x65,top,0);
  }
  if (iVar4 != width) {
    Am_Object::Set(&window,0x66,width,0);
  }
  if (iVar5 != height) {
    Am_Object::Set(&window,0x67,height,0);
  }
  Am_Object::~Am_Object(&window);
  return;
}

Assistant:

void Configure_Notify(Am_Drawonable *draw, int left, int top, int width,
                        int height) override
  {
    Am_Wrapper *window_data = (Am_Wrapper *)draw->Get_Data_Store();
    window_data->Note_Reference();
    Am_Object window((Am_Object_Data *)window_data);
    ASSERT_WINDOW
    //// DEBUG
    // std::cout << "configure event window=" << window << " left=" << left << " top="
    //     << top << " width=" << width << " height=" << height <<std::endl;
    int w_left = window.Get(Am_LEFT);
    int w_top = window.Get(Am_TOP);
    int w_width = window.Get(Am_WIDTH);
    int w_height = window.Get(Am_HEIGHT);
    if (w_left != left)
      window.Set(Am_LEFT, left);
    if (w_top != top)
      window.Set(Am_TOP, top);
    if (w_width != width)
      window.Set(Am_WIDTH, width);
    if (w_height != height)
      window.Set(Am_HEIGHT, height);
  }